

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::TempDir_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_2d [20];
  allocator local_19;
  char *local_18;
  char *temp_dir;
  
  pcVar1 = internal::posix::GetEnv("TEST_TMPDIR");
  local_18 = pcVar1;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"/tmp/",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  return in_RDI;
}

Assistant:

std::string TempDir() {
#if defined(GTEST_CUSTOM_TEMPDIR_FUNCTION_)
  return GTEST_CUSTOM_TEMPDIR_FUNCTION_();
#elif GTEST_OS_WINDOWS_MOBILE
  return "\\temp\\";
#elif GTEST_OS_WINDOWS
  const char* temp_dir = internal::posix::GetEnv("TEMP");
  if (temp_dir == nullptr || temp_dir[0] == '\0') {
    return "\\temp\\";
  } else if (temp_dir[strlen(temp_dir) - 1] == '\\') {
    return temp_dir;
  } else {
    return std::string(temp_dir) + "\\";
  }
#elif GTEST_OS_LINUX_ANDROID
  const char* temp_dir = internal::posix::GetEnv("TEST_TMPDIR");
  if (temp_dir == nullptr || temp_dir[0] == '\0') {
    return "/data/local/tmp/";
  } else {
    return temp_dir;
  }
#elif GTEST_OS_LINUX
  const char* temp_dir = internal::posix::GetEnv("TEST_TMPDIR");
  if (temp_dir == nullptr || temp_dir[0] == '\0') {
    return "/tmp/";
  } else {
    return temp_dir;
  }
#else
  return "/tmp/";
#endif  // GTEST_OS_WINDOWS_MOBILE
}